

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::Attribute_Access<int,_MyException>::do_call
          (Attribute_Access<int,_MyException> *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  Type_Conversions *this_00;
  MyException *pMVar1;
  Boxed_Value *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar3;
  Boxed_Value BVar4;
  
  this_00 = (t_conversions->m_conversions)._M_data;
  if ((*(byte *)((this_00->m_mutex)._M_impl._M_rwlock.__align + 0x10) & 1) == 0) {
    pMVar1 = boxed_cast<MyException*>((chaiscript *)this_00,in_RCX,t_conversions);
    sVar3 = Boxed_Value::Object_Data::get<int>
                      ((Object_Data *)this,
                       (reference_wrapper<int>)
                       (&pMVar1->super_runtime_error + (long)params[4].m_begin),false);
    _Var2 = sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    pMVar1 = boxed_cast<MyException_const*>((chaiscript *)this_00,in_RCX,t_conversions);
    sVar3 = Boxed_Value::Object_Data::get<int_const>
                      ((Object_Data *)this,
                       (reference_wrapper<const_int>)
                       (&pMVar1->super_runtime_error + (long)params[4].m_begin),true);
    _Var2 = sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const Boxed_Value &bv = params[0];
        if (bv.is_const()) {
          const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        } else {
          Class *o = boxed_cast<Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        }
      }